

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O0

void do_follow(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *ch_00;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var3;
  CHAR_DATA *victim;
  char arg [4608];
  CHAR_DATA *in_stack_ffffffffffffedd8;
  void *arg2;
  char *in_stack_ffffffffffffede0;
  char in_stack_ffffffffffffede8;
  uint7 in_stack_ffffffffffffede9;
  CHAR_DATA *in_stack_ffffffffffffedf0;
  CHAR_DATA *in_stack_ffffffffffffedf8;
  CHAR_DATA *in_stack_ffffffffffffee58;
  CHAR_DATA *in_stack_ffffffffffffee60;
  int in_stack_ffffffffffffeedc;
  CHAR_DATA *in_stack_ffffffffffffeee0;
  char *in_stack_ffffffffffffffe0;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  
  one_argument(in_stack_ffffffffffffede0,(char *)in_stack_ffffffffffffedd8);
  if (in_stack_ffffffffffffede8 == '\0') {
    send_to_char((char *)in_stack_ffffffffffffedf0,
                 (CHAR_DATA *)((ulong)in_stack_ffffffffffffede9 << 8));
  }
  else {
    ch_00 = get_char_room(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    if (ch_00 == (CHAR_DATA *)0x0) {
      send_to_char((char *)in_stack_ffffffffffffedf0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
    }
    else {
      bVar1 = is_affected_by((CHAR_DATA *)
                             CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),
                             (int)((ulong)ch_00 >> 0x20));
      if ((bVar1) && (in_RDI->master != (CHAR_DATA *)0x0)) {
        act((char *)in_stack_ffffffffffffedf0,
            (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),ch_00,
            in_stack_ffffffffffffedd8,0);
      }
      else if (ch_00 == in_RDI) {
        if (in_RDI->master == (CHAR_DATA *)0x0) {
          send_to_char((char *)in_stack_ffffffffffffedf0,
                       (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
        }
        else {
          stop_follower(ch_00);
        }
      }
      else {
        bVar1 = is_npc(in_stack_ffffffffffffedd8);
        if (!bVar1) {
          arg2 = (void *)ch_00->act[0];
          _Var3 = std::pow<int,int>(0,0x52a614);
          if ((((ulong)arg2 & (long)_Var3) != 0) &&
             ((iVar2 = get_skill(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeedc), iVar2 == 0 ||
              (bVar1 = can_see(in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0), bVar1)))) {
            iVar2 = get_skill(in_stack_ffffffffffffeee0,in_stack_ffffffffffffeedc);
            if ((0 < iVar2) &&
               (bVar1 = can_see(in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0), bVar1)) {
              act((char *)in_stack_ffffffffffffedf0,
                  (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),ch_00,
                  arg2,0);
            }
            act((char *)in_stack_ffffffffffffedf0,
                (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),ch_00,
                arg2,0);
            return;
          }
        }
        bVar1 = is_affected(ch_00,(int)gsn_sphere_of_plasma);
        if (bVar1) {
          send_to_char((char *)in_stack_ffffffffffffedf0,
                       (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
        }
        else {
          bVar1 = is_affected(in_RDI,(int)gsn_sphere_of_plasma);
          if (bVar1) {
            send_to_char((char *)in_stack_ffffffffffffedf0,
                         (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8))
            ;
          }
          else {
            _Var3 = std::pow<int,int>(0,0x52a750);
            in_RDI->act[0] = ((long)_Var3 ^ 0xffffffffffffffffU) & in_RDI->act[0];
            if (in_RDI->master != (CHAR_DATA *)0x0) {
              stop_follower(ch_00);
            }
            add_follower(in_stack_ffffffffffffee60,in_stack_ffffffffffffee58);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void do_follow(CHAR_DATA *ch, char *argument)
{
	/* RT changed to allow unlimited following and follow the NOFOLLOW rules */
	char arg[MAX_INPUT_LENGTH];
	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Follow whom?\n\r", ch);
		return;
	}

	auto victim = get_char_room(ch, arg);
	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (is_affected_by(ch, AFF_CHARM) && ch->master != nullptr)
	{
		act("But you'd rather follow $N!", ch, nullptr, ch->master, TO_CHAR);
		return;
	}

	if (victim == ch)
	{
		if (ch->master == nullptr)
		{
			send_to_char("You already follow yourself.\n\r", ch);
			return;
		}

		stop_follower(ch);
		return;
	}

	if (!is_npc(victim) && IS_SET(victim->act, PLR_NOFOLLOW) && (get_skill(ch, gsn_trail) == 0 || can_see(victim, ch)))
	{
		if (get_skill(ch, gsn_trail) > 0 && can_see(victim, ch))
			act("You can't very well trail someone if they can see you.", ch, nullptr, nullptr, TO_CHAR);

		act("$N doesn't seem to want any followers.\n\r", ch, nullptr, victim, TO_CHAR);
		return;
	}

	if (is_affected(victim, gsn_sphere_of_plasma))
	{
		send_to_char("They are encased in a sphere of plasma!\n\r", ch);
		return;
	}
	if (is_affected(ch, gsn_sphere_of_plasma))
	{
		send_to_char("You are encased in a sphere of plasma!\n\r", ch);
		return;
	}

	REMOVE_BIT(ch->act, PLR_NOFOLLOW);

	if (ch->master != nullptr)
		stop_follower(ch);

	add_follower(ch, victim);
}